

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colamd.c
# Opt level: O0

int garbage_collection(int n_row,int n_col,Colamd_Row *Row,Colamd_Col *Col,int *A,int *pfree)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int local_4c;
  int length;
  int c;
  int r;
  int j;
  int *pdest;
  int *psrc;
  int *pfree_local;
  int *A_local;
  Colamd_Col *Col_local;
  Colamd_Row *Row_local;
  int n_col_local;
  int n_row_local;
  
  _r = A;
  for (local_4c = 0; local_4c < n_col; local_4c = local_4c + 1) {
    if (-1 < Col[local_4c].start) {
      iVar1 = Col[local_4c].start;
      Col[local_4c].start = (int)((long)_r - (long)A >> 2);
      iVar3 = Col[local_4c].length;
      pdest = A + iVar1;
      for (c = 0; c < iVar3; c = c + 1) {
        if (-1 < Row[*pdest].shared2.mark) {
          *_r = *pdest;
          _r = _r + 1;
        }
        pdest = pdest + 1;
      }
      Col[local_4c].length = (int)((long)_r - (long)(A + Col[local_4c].start) >> 2);
    }
  }
  for (length = 0; length < n_row; length = length + 1) {
    if ((Row[length].shared2.mark < 0) || (Row[length].length == 0)) {
      Row[length].shared2.mark = -1;
    }
    else {
      iVar1 = Row[length].start;
      Row[length].shared2.mark = A[iVar1];
      A[iVar1] = -1 - length;
    }
  }
  pdest = _r;
  piVar2 = pdest;
  while (pdest = piVar2, pdest < pfree) {
    piVar2 = pdest + 1;
    if (*pdest < 0) {
      iVar3 = -1 - *pdest;
      *pdest = (int)Row[iVar3].shared2;
      Row[iVar3].start = (int)((long)_r - (long)A >> 2);
      iVar1 = Row[iVar3].length;
      for (c = 0; c < iVar1; c = c + 1) {
        if (-1 < Col[*pdest].start) {
          *_r = *pdest;
          _r = _r + 1;
        }
        pdest = pdest + 1;
      }
      Row[iVar3].length = (int)((long)_r - (long)(A + Row[iVar3].start) >> 2);
      piVar2 = pdest;
    }
  }
  return (int)((long)_r - (long)A >> 2);
}

Assistant:

PRIVATE Int garbage_collection  /* returns the new value of pfree */
(
    /* === Parameters ======================================================= */

    Int n_row,			/* number of rows */
    Int n_col,			/* number of columns */
    Colamd_Row Row [],		/* row info */
    Colamd_Col Col [],		/* column info */
    Int A [],			/* A [0 ... Alen-1] holds the matrix */
    const Int *pfree			/* &A [0] ... pfree is in use */
)
{
    /* === Local variables ================================================== */

    Int *psrc ;			/* source pointer */
    Int *pdest ;		/* destination pointer */
    Int j ;			/* counter */
    Int r ;			/* a row index */
    Int c ;			/* a column index */
    Int length ;		/* length of a row or column */

#ifndef NDEBUG
    Int debug_rows ;
    DEBUG2 (("Defrag..\n")) ;
    for (psrc = &A[0] ; psrc < pfree ; psrc++) ASSERT (*psrc >= 0) ;
    debug_rows = 0 ;
#endif /* NDEBUG */

    /* === Defragment the columns =========================================== */

    pdest = &A[0] ;
    for (c = 0 ; c < n_col ; c++)
    {
	if (COL_IS_ALIVE (c))
	{
	    psrc = &A [Col [c].start] ;

	    /* move and compact the column */
	    ASSERT (pdest <= psrc) ;
	    Col [c].start = (Int) (pdest - &A [0]) ;
	    length = Col [c].length ;
	    for (j = 0 ; j < length ; j++)
	    {
		r = *psrc++ ;
		if (ROW_IS_ALIVE (r))
		{
		    *pdest++ = r ;
		}
	    }
	    Col [c].length = (Int) (pdest - &A [Col [c].start]) ;
	}
    }

    /* === Prepare to defragment the rows =================================== */

    for (r = 0 ; r < n_row ; r++)
    {
	if (ROW_IS_DEAD (r) || (Row [r].length == 0))
	{
	    /* This row is already dead, or is of zero length.  Cannot compact
	     * a row of zero length, so kill it.  NOTE: in the current version,
	     * there are no zero-length live rows.  Kill the row (for the first
	     * time, or again) just to be safe. */
	    KILL_ROW (r) ;
	}
	else
	{
	    /* save first column index in Row [r].shared2.first_column */
	    psrc = &A [Row [r].start] ;
	    Row [r].shared2.first_column = *psrc ;
	    ASSERT (ROW_IS_ALIVE (r)) ;
	    /* flag the start of the row with the one's complement of row */
	    *psrc = ONES_COMPLEMENT (r) ;
#ifndef NDEBUG
	    debug_rows++ ;
#endif /* NDEBUG */
	}
    }

    /* === Defragment the rows ============================================== */

    psrc = pdest ;
    while (psrc < pfree)
    {
	/* find a negative number ... the start of a row */
	if (*psrc++ < 0)
	{
	    psrc-- ;
	    /* get the row index */
	    r = ONES_COMPLEMENT (*psrc) ;
	    ASSERT (r >= 0 && r < n_row) ;
	    /* restore first column index */
	    *psrc = Row [r].shared2.first_column ;
	    ASSERT (ROW_IS_ALIVE (r)) ;
	    ASSERT (Row [r].length > 0) ;
	    /* move and compact the row */
	    ASSERT (pdest <= psrc) ;
	    Row [r].start = (Int) (pdest - &A [0]) ;
	    length = Row [r].length ;
	    for (j = 0 ; j < length ; j++)
	    {
		c = *psrc++ ;
		if (COL_IS_ALIVE (c))
		{
		    *pdest++ = c ;
		}
	    }
	    Row [r].length = (Int) (pdest - &A [Row [r].start]) ;
	    ASSERT (Row [r].length > 0) ;
#ifndef NDEBUG
	    debug_rows-- ;
#endif /* NDEBUG */
	}
    }
    /* ensure we found all the rows */
    ASSERT (debug_rows == 0) ;

    /* === Return the new value of pfree ==================================== */

    return ((Int) (pdest - &A [0])) ;
}